

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void hashTableDestroy(HASH_TABLE *table)

{
  NAMED **ppNVar1;
  ulong uVar2;
  
  for (uVar2 = 0; ppNVar1 = table->v, uVar2 < table->size; uVar2 = uVar2 + 1) {
    if (ppNVar1[uVar2] != (NAMED *)0x0) {
      (*table->mem->free_fcn)(ppNVar1[uVar2]);
    }
  }
  if (ppNVar1 != (NAMED **)0x0) {
    (*table->mem->free_fcn)(ppNVar1);
    return;
  }
  return;
}

Assistant:

static
void hashTableDestroy(HASH_TABLE *table)
{
  size_t i;
  for (i = 0; i < table->size; i++) {
    NAMED *p = table->v[i];
    if (p)
      table->mem->free_fcn(p);
  }
  if (table->v)
    table->mem->free_fcn(table->v);
}